

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquery.cpp
# Opt level: O2

bool __thiscall QSqlQuery::prepare(QSqlQuery *this,QString *query)

{
  QSqlQueryPrivate *pQVar1;
  Data *pDVar2;
  char cVar3;
  bool bVar4;
  NumericalPrecisionPolicy NVar5;
  int iVar6;
  QSqlResult *pQVar7;
  QSqlDriver *pQVar8;
  undefined1 uVar9;
  char *pcVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_98;
  char *local_80;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  QSqlError local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 1) {
    pQVar7 = this->d->sqlResult;
    (*pQVar7->_vptr_QSqlResult[4])(pQVar7,0);
    pQVar7 = this->d->sqlResult;
    local_98.size._0_4_ = 0;
    local_98.size._4_4_ = 0;
    local_98.d._0_4_ = 0;
    local_98.d._4_4_ = 0;
    local_98.ptr._0_4_ = 0;
    local_98.ptr._4_4_ = 0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_58.size = 0;
    local_78.d = (Data *)0x0;
    local_78.ptr = (char16_t *)0x0;
    local_78.size = 0;
    QSqlError::QSqlError
              (&local_40,(QString *)&local_98,(QString *)&local_58,NoError,(QString *)&local_78);
    (*pQVar7->_vptr_QSqlResult[5])(pQVar7,&local_40);
    QSqlError::~QSqlError(&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    pQVar7 = this->d->sqlResult;
    (*pQVar7->_vptr_QSqlResult[3])(pQVar7,0xffffffffffffffff);
  }
  else {
    bVar4 = isForwardOnly(this);
    pQVar8 = driver(this);
    pQVar7 = (QSqlResult *)(**(code **)(*(long *)pQVar8 + 200))(pQVar8);
    QSqlQuery((QSqlQuery *)&local_58,pQVar7);
    pDVar2 = local_58.d;
    local_58.d = (Data *)0x0;
    pQVar1 = this->d;
    this->d = (QSqlQueryPrivate *)pDVar2;
    local_98.d._0_4_ = SUB84(pQVar1,0);
    local_98.d._4_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
    ~QSqlQuery((QSqlQuery *)&local_98);
    ~QSqlQuery((QSqlQuery *)&local_58);
    pQVar7 = this->d->sqlResult;
    (*pQVar7->_vptr_QSqlResult[8])(pQVar7,(ulong)bVar4);
  }
  pQVar7 = this->d->sqlResult;
  NVar5 = QSqlResult::numericalPrecisionPolicy(pQVar7);
  (*pQVar7->_vptr_QSqlResult[0x1d])(pQVar7,(ulong)NVar5);
  pQVar8 = driver(this);
  if (pQVar8 == (QSqlDriver *)0x0) {
    lcSqlQuery();
    if (((byte)lcSqlQuery::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0)
    goto LAB_0012327c;
    local_80 = lcSqlQuery::category.name;
    pcVar10 = "QSqlQuery::prepare: no driver";
  }
  else {
    pQVar8 = driver(this);
    cVar3 = (**(code **)(*(long *)pQVar8 + 0x60))(pQVar8);
    if (cVar3 != '\0') {
      pQVar8 = driver(this);
      bVar4 = QSqlDriver::isOpenError(pQVar8);
      if (!bVar4) {
        if ((query->d).size != 0) {
          pQVar7 = this->d->sqlResult;
          iVar6 = (*pQVar7->_vptr_QSqlResult[0xb])(pQVar7,query);
          uVar9 = (undefined1)iVar6;
          goto LAB_0012327e;
        }
        lcSqlQuery();
        if (((byte)lcSqlQuery::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0
           ) goto LAB_0012327c;
        local_80 = lcSqlQuery::category.name;
        pcVar10 = "QSqlQuery::prepare: empty query";
        goto LAB_0012331c;
      }
    }
    lcSqlQuery();
    if (((byte)lcSqlQuery::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0) {
LAB_0012327c:
      uVar9 = 0;
      goto LAB_0012327e;
    }
    local_80 = lcSqlQuery::category.name;
    pcVar10 = "QSqlQuery::prepare: database not open";
  }
LAB_0012331c:
  local_98.size._4_4_ = 0;
  local_98.size._0_4_ = 0;
  local_98.ptr._4_4_ = 0;
  local_98.ptr._0_4_ = 0;
  local_98.d._4_4_ = 0;
  local_98.d._0_4_ = 2;
  uVar9 = 0;
  lcSqlQuery::category.name = local_80;
  QMessageLogger::warning((char *)&local_98,pcVar10);
LAB_0012327e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar9;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlQuery::prepare(const QString& query)
{
    if (d->ref.loadRelaxed() != 1) {
        bool fo = isForwardOnly();
        *this = QSqlQuery(driver()->createResult());
        setForwardOnly(fo);
        d->sqlResult->setNumericalPrecisionPolicy(d->sqlResult->numericalPrecisionPolicy());
    } else {
        d->sqlResult->setActive(false);
        d->sqlResult->setLastError(QSqlError());
        d->sqlResult->setAt(QSql::BeforeFirstRow);
        d->sqlResult->setNumericalPrecisionPolicy(d->sqlResult->numericalPrecisionPolicy());
    }
    if (!driver()) {
        qCWarning(lcSqlQuery, "QSqlQuery::prepare: no driver");
        return false;
    }
    if (!driver()->isOpen() || driver()->isOpenError()) {
        qCWarning(lcSqlQuery, "QSqlQuery::prepare: database not open");
        return false;
    }
    if (query.isEmpty()) {
        qCWarning(lcSqlQuery, "QSqlQuery::prepare: empty query");
        return false;
    }
#ifdef QT_DEBUG_SQL
    qCDebug(lcSqlQuery, "\n QSqlQuery::prepare: %ls", qUtf16Printable(query));
#endif
    return d->sqlResult->savePrepare(query);
}